

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::allow_move(xml_node parent,xml_node child)

{
  bool bVar1;
  xml_node_type parent_00;
  xml_node_type child_00;
  unspecified_bool_type p_Var2;
  xml_node local_38;
  xml_node cur;
  xml_node local_28;
  xml_node local_20;
  xml_node child_local;
  xml_node parent_local;
  
  local_20._root = child._root;
  child_local = parent;
  parent_00 = xml_node::type(&child_local);
  child_00 = xml_node::type(&local_20);
  bVar1 = allow_insert_child(parent_00,child_00);
  if (bVar1) {
    local_28 = xml_node::root(&child_local);
    cur = xml_node::root(&local_20);
    bVar1 = xml_node::operator!=(&local_28,&cur);
    if (bVar1) {
      parent_local._root._7_1_ = false;
    }
    else {
      local_38._root = child_local._root;
      while (p_Var2 = xml_node::operator_cast_to_function_pointer(&local_38),
            p_Var2 != (unspecified_bool_type)0x0) {
        bVar1 = xml_node::operator==(&local_38,&local_20);
        if (bVar1) {
          return false;
        }
        local_38 = xml_node::parent(&local_38);
      }
      parent_local._root._7_1_ = true;
    }
  }
  else {
    parent_local._root._7_1_ = false;
  }
  return parent_local._root._7_1_;
}

Assistant:

PUGI__FN bool allow_move(xml_node parent, xml_node child)
	{
		// check that child can be a child of parent
		if (!allow_insert_child(parent.type(), child.type()))
			return false;

		// check that node is not moved between documents
		if (parent.root() != child.root())
			return false;

		// check that new parent is not in the child subtree
		xml_node cur = parent;

		while (cur)
		{
			if (cur == child)
				return false;

			cur = cur.parent();
		}

		return true;
	}